

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O2

void __thiscall
ParserBuilder::ParserBuilder
          (ParserBuilder *this,ParameterCollection *model,
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *pretrained)

{
  LookupParameter *this_00;
  Parameter *this_01;
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  __node_base *p_Var4;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  initializer_list<unsigned_int> x_21;
  initializer_list<unsigned_int> x_22;
  initializer_list<unsigned_int> x_23;
  initializer_list<unsigned_int> x_24;
  initializer_list<unsigned_int> x_25;
  initializer_list<unsigned_int> x_26;
  allocator local_c9;
  string local_c8 [32];
  uint local_a8;
  uint local_a4;
  value_type it;
  
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->stack_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->output_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->buffer_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->action_lstm,LAYERS,ACTION_DIM,HIDDEN_DIM,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->ent_lstm_fwd,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->ent_lstm_rev,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model,false);
  uVar1 = VOCAB_SIZE;
  local_a8 = INPUT_DIM;
  x._M_len = 1;
  x._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar3 = (uint)model;
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar3,(Dim *)(ulong)uVar1,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_w = uVar2;
  std::__cxx11::string::~string(local_c8);
  this_00 = &this->p_t;
  dynet::LookupParameter::LookupParameter(this_00);
  uVar1 = ACTION_SIZE;
  local_a8 = ACTION_DIM;
  x_00._M_len = 1;
  x_00._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_00);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar3,(Dim *)(ulong)uVar1,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_a = uVar2;
  std::__cxx11::string::~string(local_c8);
  uVar1 = ACTION_SIZE;
  local_a8 = REL_DIM;
  x_01._M_len = 1;
  x_01._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_01);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar3,(Dim *)(ulong)uVar1,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_r = uVar2;
  std::__cxx11::string::~string(local_c8);
  dynet::LookupParameter::LookupParameter(&this->p_p);
  local_a8 = HIDDEN_DIM;
  x_02._M_len = 1;
  x_02._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_02);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_pbias = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = HIDDEN_DIM;
  local_a4 = HIDDEN_DIM;
  x_03._M_len = 2;
  x_03._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_03);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_A = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = HIDDEN_DIM;
  local_a4 = HIDDEN_DIM;
  x_04._M_len = 2;
  x_04._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_04);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_B = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = HIDDEN_DIM;
  local_a4 = HIDDEN_DIM;
  x_05._M_len = 2;
  x_05._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_05);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_O = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = HIDDEN_DIM;
  local_a4 = HIDDEN_DIM;
  x_06._M_len = 2;
  x_06._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_06);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_S = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  local_a4 = LSTM_INPUT_DIM;
  x_07._M_len = 2;
  x_07._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_07);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_H = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  local_a4 = LSTM_INPUT_DIM;
  x_08._M_len = 2;
  x_08._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_08);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_D = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  local_a4 = REL_DIM;
  x_09._M_len = 2;
  x_09._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_09);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_R = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  local_a4 = INPUT_DIM;
  x_10._M_len = 2;
  x_10._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_10);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_w2l = uVar2;
  std::__cxx11::string::~string(local_c8);
  dynet::Parameter::Parameter(&this->p_p2l);
  this_01 = &this->p_t2l;
  dynet::Parameter::Parameter(this_01);
  local_a8 = LSTM_INPUT_DIM;
  x_11._M_len = 1;
  x_11._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_11);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_ib = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  x_12._M_len = 1;
  x_12._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_12);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_cbias = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = ACTION_SIZE;
  local_a4 = HIDDEN_DIM;
  x_13._M_len = 2;
  x_13._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_13);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_p2a = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = ACTION_DIM;
  x_14._M_len = 1;
  x_14._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_14);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_action_start = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = ACTION_SIZE;
  x_15._M_len = 1;
  x_15._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_15);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_abias = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  x_16._M_len = 1;
  x_16._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_16);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_buffer_guard = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  x_17._M_len = 1;
  x_17._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_17);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_stack_guard = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  x_18._M_len = 1;
  x_18._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_18);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_output_guard = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  x_19._M_len = 1;
  x_19._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_19);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_start_of_word = uVar2;
  std::__cxx11::string::~string(local_c8);
  local_a8 = LSTM_INPUT_DIM;
  x_20._M_len = 1;
  x_20._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_20);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_end_of_word = uVar2;
  std::__cxx11::string::~string(local_c8);
  uVar1 = CHAR_SIZE;
  local_a8 = INPUT_DIM;
  x_21._M_len = 1;
  x_21._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_21);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar3,(Dim *)(ulong)uVar1,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->char_emb = uVar2;
  std::__cxx11::string::~string(local_c8);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->fw_char_lstm,LAYERS,LSTM_INPUT_DIM,LSTM_CHAR_OUTPUT_DIM >> 1,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->bw_char_lstm,LAYERS,LSTM_INPUT_DIM,LSTM_CHAR_OUTPUT_DIM >> 1,model,false);
  local_a8 = LSTM_INPUT_DIM;
  local_a4 = LSTM_INPUT_DIM * 2;
  x_22._M_len = 2;
  x_22._M_array = &local_a8;
  dynet::Dim::Dim((Dim *)&it,x_22);
  std::__cxx11::string::string(local_c8,"",&local_c9);
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
  *(undefined8 *)&this->p_cW = uVar2;
  std::__cxx11::string::~string(local_c8);
  uVar1 = POS_SIZE;
  if (USE_POS == true) {
    local_a8 = POS_DIM;
    x_23._M_len = 1;
    x_23._M_array = &local_a8;
    dynet::Dim::Dim((Dim *)&it,x_23);
    std::__cxx11::string::string(local_c8,"",&local_c9);
    uVar2 = dynet::ParameterCollection::add_lookup_parameters
                      (uVar3,(Dim *)(ulong)uVar1,(string *)&it,(Device *)local_c8);
    *(undefined8 *)&this->p_p = uVar2;
    std::__cxx11::string::~string(local_c8);
    local_a8 = LSTM_INPUT_DIM;
    local_a4 = POS_DIM;
    x_24._M_len = 2;
    x_24._M_array = &local_a8;
    dynet::Dim::Dim((Dim *)&it,x_24);
    std::__cxx11::string::string(local_c8,"",&local_c9);
    uVar2 = dynet::ParameterCollection::add_parameters
                      ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
    *(undefined8 *)&this->p_p2l = uVar2;
    std::__cxx11::string::~string(local_c8);
  }
  uVar1 = VOCAB_SIZE;
  if ((pretrained->_M_h)._M_element_count == 0) {
    dynet::LookupParameter::LookupParameter((LookupParameter *)&it,(LookupParameterStorage *)0x0);
    *(ulong *)this_00 = CONCAT44(it._4_4_,it.first);
    dynet::Parameter::Parameter((Parameter *)&it,(ParameterStorage *)0x0);
    *(ulong *)this_01 = CONCAT44(it._4_4_,it.first);
  }
  else {
    local_a8 = PRETRAINED_DIM;
    x_25._M_len = 1;
    x_25._M_array = &local_a8;
    dynet::Dim::Dim((Dim *)&it,x_25);
    std::__cxx11::string::string(local_c8,"",&local_c9);
    uVar2 = dynet::ParameterCollection::add_lookup_parameters
                      (uVar3,(Dim *)(ulong)uVar1,(string *)&it,(Device *)local_c8);
    *(undefined8 *)this_00 = uVar2;
    std::__cxx11::string::~string(local_c8);
    p_Var4 = &(pretrained->_M_h)._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>::pair
                (&it,(pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *)
                     (p_Var4 + 1));
      dynet::LookupParameter::initialize((uint)this_00,(vector *)(ulong)it.first);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&it.second.super__Vector_base<float,_std::allocator<float>_>);
    }
    local_a8 = LSTM_INPUT_DIM;
    local_a4 = PRETRAINED_DIM;
    x_26._M_len = 2;
    x_26._M_array = &local_a8;
    dynet::Dim::Dim((Dim *)&it,x_26);
    std::__cxx11::string::string(local_c8,"",&local_c9);
    uVar2 = dynet::ParameterCollection::add_parameters
                      ((Dim *)model,0.0,(string *)&it,(Device *)local_c8);
    *(undefined8 *)this_01 = uVar2;
    std::__cxx11::string::~string(local_c8);
  }
  return;
}

Assistant:

explicit ParserBuilder(ParameterCollection & model, const unordered_map<unsigned, vector<float>>& pretrained) :
      stack_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      output_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      buffer_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      action_lstm(LAYERS, ACTION_DIM, HIDDEN_DIM, model),
      ent_lstm_fwd(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), 
      ent_lstm_rev(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model),
      p_w(model.add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_a(model.add_lookup_parameters(ACTION_SIZE, {ACTION_DIM})),
      p_r(model.add_lookup_parameters(ACTION_SIZE, {REL_DIM})),
      p_pbias(model.add_parameters({HIDDEN_DIM})),
      p_A(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_B(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_O(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_S(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_H(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM})),
      p_D(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM})),
      p_R(model.add_parameters({LSTM_INPUT_DIM, REL_DIM})),
      p_w2l(model.add_parameters({LSTM_INPUT_DIM, INPUT_DIM})),
      p_ib(model.add_parameters({LSTM_INPUT_DIM})),
      p_cbias(model.add_parameters({LSTM_INPUT_DIM})),
      p_p2a(model.add_parameters({ACTION_SIZE, HIDDEN_DIM})),
      p_action_start(model.add_parameters({ACTION_DIM})),
      p_abias(model.add_parameters({ACTION_SIZE})),

      p_buffer_guard(model.add_parameters({LSTM_INPUT_DIM})),
      p_stack_guard(model.add_parameters({LSTM_INPUT_DIM})),
      p_output_guard(model.add_parameters({LSTM_INPUT_DIM})),

      p_start_of_word(model.add_parameters({LSTM_INPUT_DIM})), //Miguel
      p_end_of_word(model.add_parameters({LSTM_INPUT_DIM})), //Miguel 

      char_emb(model.add_lookup_parameters(CHAR_SIZE, {INPUT_DIM})),//Miguel

//      fw_char_lstm(LAYERS, LSTM_CHAR_OUTPUT_DIM, LSTM_INPUT_DIM, model), //Miguel
//      bw_char_lstm(LAYERS, LSTM_CHAR_OUTPUT_DIM, LSTM_INPUT_DIM,  model), //Miguel

      fw_char_lstm(LAYERS, LSTM_INPUT_DIM, LSTM_CHAR_OUTPUT_DIM/2, model), //Miguel 
      bw_char_lstm(LAYERS, LSTM_INPUT_DIM, LSTM_CHAR_OUTPUT_DIM/2, model), /*Miguel*/
      p_cW(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM * 2})) { //ner. {
    if (USE_POS) {
      p_p = model.add_lookup_parameters(POS_SIZE, {POS_DIM});
      p_p2l = model.add_parameters({LSTM_INPUT_DIM, POS_DIM});
    }
    if (pretrained.size() > 0) {
      p_t = model.add_lookup_parameters(VOCAB_SIZE, {PRETRAINED_DIM});
      for (auto it : pretrained)
        p_t.initialize(it.first, it.second);
      p_t2l = model.add_parameters({LSTM_INPUT_DIM, PRETRAINED_DIM});
    } else {
      p_t = nullptr;
      p_t2l = nullptr;
    }
  }